

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t sblines(Terminal *term)

{
  wchar_t wVar1;
  
  wVar1 = count234(term->scrollback);
  if (((term->erase_to_scrollback == true) && (term->alt_which != L'\0')) &&
     (term->alt_screen != (tree234 *)0x0)) {
    wVar1 = wVar1 + term->alt_sblines;
  }
  return wVar1;
}

Assistant:

static int sblines(Terminal *term)
{
    int sblines = count234(term->scrollback);
    if (term->erase_to_scrollback &&
        term->alt_which && term->alt_screen) {
            sblines += term->alt_sblines;
    }
    return sblines;
}